

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O0

bool attack(MonsterThing *mp)

{
  ItemThing *obj_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  reference ppIVar8;
  ItemThing *obj;
  iterator __end4;
  iterator __begin4;
  list<ItemThing_*,_std::allocator<ItemThing_*>_> *__range4;
  ItemThing *pIStack_38;
  int nobj;
  ItemThing *steal;
  int local_28;
  int lastpurse;
  int fewer;
  int oldhp;
  char *mname;
  MonsterThing *mp_local;
  
  running = false;
  count = 0;
  quiet = 0;
  if ((to_death) && ((mp->flags & 0x80U) == 0)) {
    to_death = false;
    kamikaze = false;
  }
  if ((((mp->type == 'X') && (mp->disguise != 'X')) && ((player.flags & 4U) == 0)) &&
     (mp->disguise = 'X', (player.flags & 0x800U) != 0)) {
    iVar3 = (mp->pos).x;
    iVar4 = (mp->pos).y;
    iVar2 = rnd(0x1a);
    setMapDisplay(iVar3,iVar4,iVar2 + 0x41);
  }
  pcVar7 = set_mname(mp);
  iVar3 = player.stats.s_hpt;
  bVar1 = roll_em(mp,&player,(ItemThing *)0x0,false);
  mname = (char *)mp;
  if (bVar1) {
    if (mp->type == 'I') {
      if ((has_hit & 1U) != 0) {
        endmsg();
      }
    }
    else {
      if ((has_hit & 1U) != 0) {
        addmsg(".  ");
      }
      hit(pcVar7,(char *)0x0,false);
    }
    has_hit = false;
    if (player.stats.s_hpt < 1) {
      death(mp->type);
    }
    else if ((kamikaze & 1U) == 0) {
      if (max_hit < iVar3 - player.stats.s_hpt) {
        max_hit = iVar3 - player.stats.s_hpt;
      }
      if (player.stats.s_hpt <= max_hit) {
        to_death = false;
      }
    }
    iVar3 = purse;
    if ((mp->flags & 0x10000U) == 0) {
      switch(mp->type) {
      case 'A':
        rust_armor(cur_armor);
        break;
      default:
        break;
      case 'F':
        player.flags = player.flags | 0x100;
        vf_hit = vf_hit + 1;
        sprintf(monsters[5].m_stats.s_dmg,"%dx1");
        player.stats.s_hpt = player.stats.s_hpt + -1;
        if (player.stats.s_hpt < 1) {
          death('F');
        }
        break;
      case 'I':
        player.flags = player.flags & 0xffffdfff;
        if (no_command == 0) {
          addmsg("you are frozen");
          if ((terse & 1U) == 0) {
            addmsg(" by the %s",pcVar7);
          }
          endmsg();
        }
        iVar3 = rnd(2);
        no_command = iVar3 + 2 + no_command;
        if (0x32 < no_command) {
          death('h');
        }
        break;
      case 'L':
        iVar4 = rnd(level * 10 + 0x32);
        purse = purse - (iVar4 + 2);
        iVar4 = save(3);
        if (iVar4 == 0) {
          iVar4 = rnd(level * 10 + 0x32);
          iVar2 = rnd(level * 10 + 0x32);
          iVar5 = rnd(level * 10 + 0x32);
          iVar6 = rnd(level * 10 + 0x32);
          purse = purse - (iVar4 + iVar2 + iVar5 + iVar6 + 8);
        }
        if (purse < 0) {
          purse = 0;
        }
        remove_mon(&mp->pos,mp,false);
        mname = (char *)0x0;
        if (purse != iVar3) {
          msg("your purse feels lighter");
        }
        break;
      case 'N':
        pIStack_38 = (ItemThing *)0x0;
        __range4._4_4_ = 0;
        __end4 = std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::begin(&player.pack);
        obj = (ItemThing *)
              std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::end(&player.pack);
        while (bVar1 = std::operator!=(&__end4,(_Self *)&obj), bVar1) {
          ppIVar8 = std::_List_iterator<ItemThing_*>::operator*(&__end4);
          obj_00 = *ppIVar8;
          if (((obj_00 != cur_armor) && (obj_00 != cur_weapon)) &&
             ((obj_00 != cur_ring[0] &&
              ((obj_00 != cur_ring[1] && (bVar1 = is_magic(obj_00), bVar1)))))) {
            __range4._4_4_ = __range4._4_4_ + 1;
            iVar3 = rnd(__range4._4_4_);
            if (iVar3 == 0) {
              pIStack_38 = obj_00;
            }
          }
          std::_List_iterator<ItemThing_*>::operator++(&__end4);
        }
        if (pIStack_38 != (ItemThing *)0x0) {
          remove_mon(&mp->pos,places[(mp->pos).x * 0x20 + (mp->pos).y].p_monst,false);
          mname = (char *)0x0;
          leave_pack(pIStack_38,false,false);
          pcVar7 = inv_name(pIStack_38,true);
          msg("she stole %s!",pcVar7);
          if (pIStack_38 != (ItemThing *)0x0) {
            operator_delete(pIStack_38);
          }
        }
        break;
      case 'R':
        iVar3 = save(0);
        if (iVar3 == 0) {
          if (((cur_ring[0] == (ItemThing *)0x0) || (cur_ring[0]->which != 2)) &&
             ((cur_ring[1] == (ItemThing *)0x0 || (cur_ring[1]->which != 2)))) {
            chg_str(-1);
            if ((terse & 1U) == 0) {
              msg("you feel a bite in your leg and now feel weaker");
            }
            else {
              msg("a bite has weakened you");
            }
          }
          else if ((to_death & 1U) == 0) {
            if ((terse & 1U) == 0) {
              msg("a bite momentarily weakens you");
            }
            else {
              msg("bite has no effect");
            }
          }
        }
        break;
      case 'V':
      case 'W':
        iVar3 = rnd(100);
        iVar4 = 0x1e;
        if (mp->type == 'W') {
          iVar4 = 0xf;
        }
        if (iVar3 < iVar4) {
          if (mp->type == 'W') {
            if (player.stats.s_exp == 0) {
              death('W');
            }
            if (player.stats.s_lvl + -1 == 0) {
              player.stats.s_exp = 0;
              player.stats.s_lvl = 1;
            }
            else {
              player.stats.s_exp = e_levels[player.stats.s_lvl + -2] + 1;
              player.stats.s_lvl = player.stats.s_lvl + -1;
            }
            local_28 = roll(1,10);
          }
          else {
            local_28 = roll(1,3);
          }
          player.stats.s_hpt = player.stats.s_hpt - local_28;
          player.stats.s_maxhp = player.stats.s_maxhp - local_28;
          if (player.stats.s_hpt < 1) {
            player.stats.s_hpt = 1;
          }
          if (player.stats.s_maxhp < 1) {
            death(mp->type);
          }
          msg("you suddenly feel weaker");
        }
      }
    }
  }
  else if (mp->type != 'I') {
    if ((has_hit & 1U) != 0) {
      addmsg(".  ");
      has_hit = false;
    }
    if (mp->type == 'F') {
      take_damage(vf_hit,0x46);
    }
    miss(pcVar7,(char *)0x0,false);
  }
  if (((fight_flush & 1U) != 0) && ((to_death & 1U) == 0)) {
    flush_type();
  }
  count = 0;
  status(false);
  return mname == (char *)0x0;
}

Assistant:

bool attack(MonsterThing *mp)
{
    const char *mname;
    int oldhp;

    /*
     * Since this is an attack, stop running and any healing that was
     * going on at the time.
     */
    running = false;
    count = 0;
    quiet = 0;
    if (to_death && !on(*mp, ISTARGET))
    {
        to_death = false;
        kamikaze = false;
    }
    if (mp->type == 'X' && mp->disguise != 'X' && !on(player, ISBLIND))
    {
        mp->disguise = 'X';
        if (on(player, ISHALU))
            setMapDisplay(mp->pos.x, mp->pos.y, rnd(26) + 'A');
    }
    mname = set_mname(mp);
    oldhp = player.stats.s_hpt;
    if (roll_em(mp, &player, nullptr, false))
    {
        if (mp->type != 'I')
        {
            if (has_hit)
                addmsg(".  ");
            hit(mname, nullptr, false);
        }
        else
            if (has_hit)
                endmsg();
        has_hit = false;
        if (player.stats.s_hpt <= 0)
            death(mp->type);        /* Bye bye life ... */
        else if (!kamikaze)
        {
            oldhp -= player.stats.s_hpt;
            if (oldhp > max_hit)
                max_hit = oldhp;
            if (player.stats.s_hpt <= max_hit)
                to_death = false;
        }
        if (!on(*mp, ISCANC))
            switch (mp->type)
            {
                case 'A':
                    /*
                     * If an aquator hits, you can lose armor class.
                     */
                    rust_armor(cur_armor);
                when 'I':
                    /*
                     * The ice monster freezes you
                     */
                    player.flags &= ~ISRUN;
                    if (!no_command)
                    {
                        addmsg("you are frozen");
                        if (!terse)
                            addmsg(" by the %s", mname);
                        endmsg();
                    }
                    no_command += rnd(2) + 2;
                    if (no_command > BORE_LEVEL)
                        death('h');
                when 'R':
                    /*
                     * Rattlesnakes have poisonous bites
                     */
                    if (!save(VS_POISON))
                    {
                        if (!ISWEARING(R_SUSTSTR))
                        {
                            chg_str(-1);
                            if (!terse)
                                msg("you feel a bite in your leg and now feel weaker");
                            else
                                msg("a bite has weakened you");
                        }
                        else if (!to_death)
                        {
                            if (!terse)
                                msg("a bite momentarily weakens you");
                            else
                                msg("bite has no effect");
                        }
                    }
                when 'W':
                case 'V':
                    /*
                     * Wraiths might drain energy levels, and Vampires
                     * can steal max_hp
                     */
                    if (rnd(100) < (mp->type == 'W' ? 15 : 30))
                    {
                        int fewer;

                        if (mp->type == 'W')
                        {
                            if (player.stats.s_exp == 0)
                                death('W');                /* All levels gone */
                            if (--player.stats.s_lvl == 0)
                            {
                                player.stats.s_exp = 0;
                                player.stats.s_lvl = 1;
                            }
                            else
                                player.stats.s_exp = e_levels[player.stats.s_lvl-1]+1;
                            fewer = roll(1, 10);
                        }
                        else
                            fewer = roll(1, 3);
                        player.stats.s_hpt -= fewer;
                        player.stats.s_maxhp -= fewer;
                        if (player.stats.s_hpt <= 0)
                            player.stats.s_hpt = 1;
                        if (player.stats.s_maxhp <= 0)
                            death(mp->type);
                        msg("you suddenly feel weaker");
                    }
                when 'F':
                    /*
                     * Venus Flytrap stops the poor guy from moving
                     */
                    player.flags |= ISHELD;
                    sprintf(monsters['F'-'A'].m_stats.s_dmg,"%dx1", ++vf_hit);
                    if (--player.stats.s_hpt <= 0)
                        death('F');
                when 'L':
                {
                    /*
                     * Leperachaun steals some gold
                     */
                    int lastpurse;

                    lastpurse = purse;
                    purse -= GOLDCALC;
                    if (!save(VS_MAGIC))
                        purse -= GOLDCALC + GOLDCALC + GOLDCALC + GOLDCALC;
                    if (purse < 0)
                        purse = 0;
                    remove_mon(&mp->pos, mp, false);
                    mp=nullptr;
                    if (purse != lastpurse)
                        msg("your purse feels lighter");
                }
                when 'N':
                {
                    ItemThing *steal;
                    int nobj;

                    /*
                     * Nymph's steal a magic item, look through the pack
                     * and pick out one we like.
                     */
                    steal = nullptr;
                    nobj = 0;
                    for (ItemThing* obj : player.pack)
                        if (obj != cur_armor && obj != cur_weapon && obj != cur_ring[LEFT] && obj != cur_ring[RIGHT] && is_magic(obj) && rnd(++nobj) == 0)
                            steal = obj;
                    if (steal != nullptr)
                    {
                        remove_mon(&mp->pos, monster_at(mp->pos.x, mp->pos.y), false);
                        mp=nullptr;
                        leave_pack(steal, false, false);
                        msg("she stole %s!", inv_name(steal, true));
                        delete steal;
                    }
                }
                otherwise:
                    break;
            }
    }
    else if (mp->type != 'I')
    {
        if (has_hit)
        {
            addmsg(".  ");
            has_hit = false;
        }
        if (mp->type == 'F')
        {
            take_damage(vf_hit, 'F');
        }
        miss(mname, nullptr, false);
    }
    if (fight_flush && !to_death)
        flush_type();
    count = 0;
    status(false);
    if (mp == nullptr)
        return true;
    else
        return false;
}